

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O1

bool __thiscall
ON_SimpleArray<VertexToDuplicate>::QuickSortAndRemoveDuplicates
          (ON_SimpleArray<VertexToDuplicate> *this,
          _func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *compar)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  ON_SubDVertex *pOVar3;
  ON_SubDFace *pOVar4;
  undefined8 uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  VertexToDuplicate *pVVar9;
  int iVar10;
  long lVar11;
  
  if (this->m_a != (VertexToDuplicate *)0x0) {
    iVar6 = this->m_count;
    if (compar != (_func_int_VertexToDuplicate_ptr_VertexToDuplicate_ptr *)0x0 && 0 < (long)iVar6) {
      if (iVar6 < 2) {
        return true;
      }
      lVar8 = 0x20;
      ON_qsort(this->m_a,(long)iVar6,0x20,(_func_int_void_ptr_void_ptr *)compar);
      iVar6 = this->m_count;
      iVar10 = 1;
      if (1 < iVar6) {
        pVVar9 = this->m_a;
        iVar10 = 1;
        lVar7 = 1;
        do {
          iVar6 = (*compar)(pVVar9,(VertexToDuplicate *)((long)&this->m_a->m_vertex + lVar8));
          if (iVar6 != 0) {
            lVar11 = (long)iVar10;
            if (lVar11 < lVar7) {
              pVVar9 = this->m_a;
              puVar1 = (undefined8 *)((long)&pVVar9->m_vertex + lVar8);
              pOVar3 = (ON_SubDVertex *)*puVar1;
              pOVar4 = (ON_SubDFace *)puVar1[1];
              puVar1 = (undefined8 *)((long)&pVVar9->m_face + lVar8 + 4);
              uVar5 = puVar1[1];
              puVar2 = (undefined8 *)((long)&pVVar9[lVar11].m_face + 4);
              *puVar2 = *puVar1;
              puVar2[1] = uVar5;
              pVVar9[lVar11].m_vertex = pOVar3;
              pVVar9[lVar11].m_face = pOVar4;
            }
            pVVar9 = this->m_a + lVar11;
            iVar10 = iVar10 + 1;
          }
          lVar7 = lVar7 + 1;
          iVar6 = this->m_count;
          lVar8 = lVar8 + 0x20;
        } while (lVar7 < iVar6);
      }
      if (iVar6 - iVar10 == 0 || iVar6 < iVar10) {
        return true;
      }
      memset(this->m_a + iVar10,0,(long)(iVar6 - iVar10) << 5);
      if (iVar10 < 0) {
        return true;
      }
      if (this->m_capacity < iVar10) {
        return true;
      }
      this->m_count = iVar10;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_SimpleArray<T>::QuickSortAndRemoveDuplicates( int (*compar)(const T*,const T*) )
{
  bool rc = false;
  if ( m_a && m_count > 0 && compar )
  {
    if (m_count > 1)
    {
      ON_qsort(m_a, m_count, sizeof(T), (int(*)(const void*, const void*))compar);
      const T* prev_ele = &m_a[0];
      int clean_count = 1;
      for (int i = 1; i < m_count; ++i)
      {
        if (0 == compar(prev_ele, &m_a[i]))
          continue; // duplicate
        if (i > clean_count)
          m_a[clean_count] = m_a[i];
        prev_ele = &m_a[clean_count];
        ++clean_count;
      }
      if (clean_count < m_count)
      {
        memset( (void*)(&m_a[clean_count]), 0, (m_count-clean_count)*sizeof(T) );
        SetCount(clean_count);
      }
    }
    rc = true;
  }
  return rc;
}